

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Game.cpp
# Opt level: O1

void gameTick(int *isOnGround,int *isOnStairs)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  EActorType EVar2;
  EDirection EVar3;
  uint *item;
  int *piVar4;
  Item *b;
  Actor *actor;
  void *item_00;
  void **ppvVar5;
  size_t sVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  Vec2i *item_01;
  uint uVar11;
  size_t sVar12;
  int iVar13;
  int iVar14;
  ulong uVar15;
  ulong uVar16;
  allocator local_51;
  string local_50;
  
  counter = counter + 1;
  if (screen != kGame) {
    return;
  }
  if (0 < ticksUntilVulnerable) {
    ticksUntilVulnerable = ticksUntilVulnerable + -1;
  }
  if (0 < ticksToShowHealth) {
    ticksToShowHealth = ticksToShowHealth + -1;
  }
  if (0 < arrowCooldown) {
    arrowCooldown = arrowCooldown + -1;
  }
  if (player.mHealth == 0) {
    screen = kGameOver;
    prepareScreenFor(kGameOver);
    return;
  }
  if (player.mStance == kAttacking) {
    evaluatePlayerAttack();
    player.mStance = kStanding;
  }
  iVar7 = player.mPosition.mY + 0x2f;
  if (-1 < player.mPosition.mY + 0x10) {
    iVar7 = player.mPosition.mY + 0x10;
  }
  iVar8 = player.mPosition.mX + 0x2f;
  if (-1 < player.mPosition.mX + 0x10) {
    iVar8 = player.mPosition.mX + 0x10;
  }
  *isOnStairs = (uint)(foregroundTiles[iVar7 >> 5][iVar8 >> 5] == 3);
  iVar7 = player.mPosition.mX + 0x1f;
  if (-1 < player.mPosition.mX) {
    iVar7 = player.mPosition.mX;
  }
  iVar8 = player.mPosition.mY + 0x2f;
  if (-1 < player.mPosition.mY + 0x10) {
    iVar8 = player.mPosition.mY + 0x10;
  }
  if (foregroundTiles[iVar8 >> 5]
      [(int)((uint)(player.mDirection == kDirectionRight) + (iVar7 >> 5))] == 1) {
    player.mSpeed.mX = 0;
  }
  iVar7 = player.mPosition.mX + 0x2f;
  if (-1 < player.mPosition.mX + 0x10) {
    iVar7 = player.mPosition.mX + 0x10;
  }
  if ((foregroundTiles[iVar8 >> 5][iVar7 >> 5] == 5) && (ticksUntilVulnerable < 1)) {
    hurtPlayer(1);
  }
  iVar7 = isOnDoor(&player);
  if (iVar7 != 0) {
    room = room + 10;
    hasKey = 0;
    prepareRoom(room);
  }
  player.mPosition.mX = player.mPosition.mX + player.mSpeed.mX;
  player.mPosition.mY = player.mPosition.mY + player.mSpeed.mY;
  if (player.mSpeed.mX == 1) {
    player.mSpeed.mX = 0;
  }
  if (player.mSpeed.mY == 1) {
    player.mSpeed.mY = 0;
  }
  enforceScreenLimits();
  if (((player.mSpeed.mX == 0) && (player.mSpeed.mY == 0)) && (player.mStance != kAltAttacking)) {
    heroFrame = 0;
  }
  iVar7 = player.mPosition.mY + 0x1f;
  if (-1 < player.mPosition.mY) {
    iVar7 = player.mPosition.mY;
  }
  iVar8 = isOnFloor(&player);
  *isOnGround = iVar8;
  if (*isOnStairs == 0) {
    player.mStance = kJumping;
  }
  else {
    player.mStance = kClimbing;
    player.mSpeed.mX = 0;
  }
  if (((*isOnGround != 0) || (*isOnStairs == 0)) &&
     (player.mStance = kStanding, player.mSpeed.mX == 0)) {
    heroFrame = 0;
  }
  uVar9 = 0;
  if (0 < iVar7 >> 5) {
    uVar9 = iVar7 >> 5;
  }
  if (player.mStance == kClimbing && player.mSpeed.mY != 0) {
    heroFrame = (heroFrame - ((heroFrame - (heroFrame + 1 >> 0x1f)) + 1U & 0xfffffffe)) + 1;
  }
  if (player.mSpeed.mX == 0) {
    if (player.mStance != kAltAttacking) goto LAB_00104580;
  }
  else if (player.mStance != kAltAttacking && *isOnGround == 0) goto LAB_00104580;
  heroFrame = (heroFrame - ((heroFrame - (heroFrame + 1 >> 0x1f)) + 1U & 0xfffffffe)) + 1;
LAB_00104580:
  if (*isOnGround != 0) {
    player.mSpeed.mX = player.mSpeed.mX / 2;
    uVar11 = player.mPosition.mY + 0x1f;
    if (-1 < player.mPosition.mY) {
      uVar11 = player.mPosition.mY;
    }
    player.mPosition.mY = uVar11 & 0xffffffe0;
  }
  if ((*isOnGround != 0) && (*isOnStairs == 0)) {
    player.mSpeed.mY = min(0,player.mSpeed.mY);
    uVar11 = player.mPosition.mY + 0x1f;
    if (-1 < player.mPosition.mY) {
      uVar11 = player.mPosition.mY;
    }
    player.mPosition.mY = min(player.mPosition.mY,uVar11 & 0xffffffe0);
  }
  if (player.mSpeed.mY < 0) {
    iVar7 = player.mPosition.mX + 0x2f;
    if (-1 < player.mPosition.mX + 0x10) {
      iVar7 = player.mPosition.mX + 0x10;
    }
    if (foregroundTiles[uVar9][iVar7 >> 5] == 1) {
      player.mSpeed.mY = -player.mSpeed.mY;
    }
  }
  if (player.mSpeed.mY < 0) {
    iVar7 = player.mPosition.mY + 0x1f;
    if (-1 < player.mPosition.mY) {
      iVar7 = player.mPosition.mY;
    }
    iVar8 = player.mPosition.mX + 0x2f;
    if (-1 < player.mPosition.mX + 0x10) {
      iVar8 = player.mPosition.mX + 0x10;
    }
    if (foregroundTiles[iVar7 >> 5][iVar8 >> 5] == 1) {
      player.mSpeed.mY = -player.mSpeed.mY;
    }
  }
  iVar7 = player.mSpeed.mY + 2;
  player.mSpeed.mY = 0;
  if (*isOnStairs == 0) {
    player.mSpeed.mY = iVar7;
  }
  if (arrows.used != 0) {
    uVar16 = 0;
    do {
      item = (uint *)arrows.items[uVar16];
      if ((item != (uint *)0x0) && (item[8] != 0)) {
        uVar11 = *item + item[2];
        *item = uVar11;
        uVar9 = item[1] + item[3];
        item[1] = uVar9;
        if ((uVar9 < 200 && uVar11 < 0x140) &&
           (foregroundTiles[uVar9 + 0x10 >> 5][(uint)(item[5] == 1) + (uVar11 >> 5)] != 1)) {
          if (foes.used != 0) {
            uVar15 = 0;
            do {
              piVar4 = (int *)foes.items[uVar15];
              if (((piVar4 != (int *)0x0) && (piVar4[8] != 0)) && (piVar4[4] != 9)) {
                uVar11 = piVar4[1] - item[1];
                uVar9 = -uVar11;
                if (0 < (int)uVar11) {
                  uVar9 = uVar11;
                }
                uVar11 = 0;
                if (uVar9 < 0x20) {
                  uVar10 = *piVar4 - *item;
                  uVar9 = -uVar10;
                  if (0 < (int)uVar10) {
                    uVar9 = uVar10;
                  }
                  uVar11 = 0;
                  if (uVar9 < 0x20) {
                    if (piVar4[5] == 0) {
                      uVar11 = (uint)(0 < (int)uVar10);
                    }
                    else {
                      uVar11 = uVar10 >> 0x1f;
                    }
                  }
                }
                if (uVar11 != 0) {
                  piVar4[7] = piVar4[7] + -1;
                  removeFromVector(&arrows,item);
                  free(item);
                  sVar6 = doors.used;
                  ppvVar5 = doors.items;
                  if ((piVar4[4] == 5) && (doors.used != 0)) {
                    sVar12 = 0;
                    do {
                      if (ppvVar5[sVar12] != (void *)0x0) {
                        *(undefined4 *)((long)ppvVar5[sVar12] + 0x10) = 3;
                      }
                      sVar12 = sVar12 + 1;
                    } while (sVar6 != sVar12);
                  }
                }
              }
              uVar15 = uVar15 + 1;
            } while (uVar15 < foes.used);
          }
        }
        else {
          removeFromVector(&arrows,item);
          free(item);
        }
      }
      uVar16 = uVar16 + 1;
    } while (uVar16 < arrows.used);
  }
  if (items.used != 0) {
    paVar1 = &local_50.field_2;
    uVar16 = 0;
    do {
      b = (Item *)items.items[uVar16];
      if (((b != (Item *)0x0) && (b->mActive != 0)) &&
         (iVar7 = collideActorItem(&player,b,0x20), iVar7 != 0)) {
        if ((b->mType == kKey) && (hasKey == 0)) {
          hasKey = 1;
          b->mActive = 0;
          std::__cxx11::string::string((string *)&local_50,pickSound,&local_51);
          playTune(&local_50);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != paVar1) {
            operator_delete(local_50._M_dataplus._M_p);
          }
          sVar6 = doors.used;
          ppvVar5 = doors.items;
          if (doors.used != 0) {
            sVar12 = 0;
            do {
              if (ppvVar5[sVar12] != (void *)0x0) {
                *(undefined4 *)((long)ppvVar5[sVar12] + 0x10) = 3;
              }
              sVar12 = sVar12 + 1;
            } while (sVar6 != sVar12);
          }
        }
        else if (b->mType == kMeat) {
          if (player.mHealth < 10) {
            std::__cxx11::string::string((string *)&local_50,pickSound,&local_51);
            playTune(&local_50);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != paVar1) {
              operator_delete(local_50._M_dataplus._M_p);
            }
            b->mActive = 0;
            player.mHealth = 10;
            std::__cxx11::string::string((string *)&local_50,pickSound,&local_51);
            playTune(&local_50);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != paVar1) {
              operator_delete(local_50._M_dataplus._M_p);
            }
          }
          ticksToShowHealth = 0xe;
        }
      }
      uVar16 = uVar16 + 1;
    } while (uVar16 < items.used);
  }
  if (foes.used != 0) {
    uVar16 = 0;
    do {
      iVar7 = player.mPosition.mY;
      actor = (Actor *)foes.items[uVar16];
      iVar8 = 0xd;
      if ((actor != (Actor *)0x0) && (actor->mActive != 0)) {
        EVar2 = actor->mType;
        if (EVar2 == kSpawner) {
          if ((foes.used < 6) && (counter % 0x28 == 0)) {
            item_01 = (Vec2i *)calloc(1,0x24);
            pushVector(&foes,item_01);
            item_01[2].mX = 1;
            item_01[1].mX = 8;
            *item_01 = actor->mPosition;
            item_01[2].mY = 1;
            *(undefined8 *)&item_01[3].mY = 0x100000002;
          }
        }
        else {
          if ((EVar2 == kHand) && (counter % 5 == 0)) {
            iVar13 = (actor->mPosition).mX;
            EVar3 = actor->mDirection;
            (actor->mSpeed).mX = (uint)(iVar13 < player.mPosition.mX) * 2 + -1;
            (actor->mSpeed).mY = (uint)((actor->mPosition).mY < iVar7) * 2 + -1;
            if (EVar3 == kDirectionRight) {
              if (0x9f < iVar13) goto LAB_00104ac0;
            }
            else if ((EVar3 == kDirectionLeft) && (iVar13 < 0xa0)) {
LAB_00104ac0:
              (actor->mSpeed).mX = -(actor->mSpeed).mX;
            }
          }
          if ((EVar2 < (kCapiroto|kClosedDoor)) && ((0x342U >> (EVar2 & 0x1f) & 1) != 0)) {
            if (actor->mHealth < 1) {
              actor->mActive = 0;
              if (EVar2 == kTinhoso) {
                hasBossOnScreen = 0;
                clearVector(&doors);
              }
              else if (EVar2 == kCapiroto) {
                screen = kVictory;
                prepareScreenFor(kVictory);
                iVar8 = 1;
              }
            }
            else if ((EVar2 | kCapiroto) == kHand) {
              iVar7 = (actor->mPosition).mX + (actor->mSpeed).mX;
              (actor->mPosition).mX = iVar7;
              iVar8 = (actor->mPosition).mY + (actor->mSpeed).mY;
              (actor->mPosition).mY = iVar8;
              if (0x11f < iVar7) {
                (actor->mSpeed).mX = -8;
                actor->mDirection = kDirectionLeft;
              }
              if (iVar7 < 0) {
                (actor->mSpeed).mX = 8;
                actor->mDirection = kDirectionRight;
              }
              iVar13 = iVar7 + 0x1f;
              if (-1 < iVar7) {
                iVar13 = iVar7;
              }
              EVar3 = actor->mDirection;
              iVar14 = iVar8 + 0x2f;
              if (-1 < iVar8 + 0x10) {
                iVar14 = iVar8 + 0x10;
              }
              if (foregroundTiles[iVar14 >> 5]
                  [(int)((uint)(EVar3 == kDirectionRight) + (iVar13 >> 5))] == 1) {
                (actor->mSpeed).mX = -(actor->mSpeed).mX;
                actor->mDirection = (uint)(EVar3 == kDirectionLeft);
              }
              if (ticksUntilVulnerable < 1) {
                uVar11 = iVar8 - player.mPosition.mY;
                uVar9 = -uVar11;
                if (0 < (int)uVar11) {
                  uVar9 = uVar11;
                }
                uVar11 = 0;
                if (uVar9 < 0x10) {
                  uVar10 = iVar7 - player.mPosition.mX;
                  uVar9 = -uVar10;
                  if (0 < (int)uVar10) {
                    uVar9 = uVar10;
                  }
                  uVar11 = 0;
                  if (uVar9 < 0x10) {
                    if (actor->mDirection == kDirectionLeft) {
                      uVar11 = (uint)(0 < (int)uVar10);
                    }
                    else {
                      uVar11 = uVar10 >> 0x1f;
                    }
                  }
                }
                if (uVar11 != 0) {
                  hurtPlayer(1);
                }
              }
              piVar4 = &(actor->mSpeed).mY;
              *piVar4 = *piVar4 + 2;
              iVar7 = isOnFloor(actor);
              iVar8 = 0;
              if (iVar7 != 0) {
                (actor->mSpeed).mY = 0;
                uVar9 = (actor->mPosition).mY;
                uVar11 = uVar9 + 0x1f;
                if (-1 < (int)uVar9) {
                  uVar11 = uVar9;
                }
                (actor->mPosition).mY = uVar11 & 0xffffffe0;
              }
            }
          }
        }
      }
      if ((iVar8 != 0xd) && (iVar8 != 0)) {
        return;
      }
      uVar16 = uVar16 + 1;
    } while (uVar16 < foes.used);
  }
  if (foes.used != 0) {
    uVar16 = 0;
    do {
      item_00 = foes.items[uVar16];
      if (((item_00 != (void *)0x0) && (*(int *)((long)item_00 + 0x10) != 5)) &&
         (*(int *)((long)item_00 + 0x1c) < 1)) {
        removeFromVector(&foes,item_00);
      }
      uVar16 = uVar16 + 1;
    } while (uVar16 < foes.used);
  }
  return;
}

Assistant:

void gameTick(int *isOnGround, int *isOnStairs) {
	int ceiling;
	size_t pos;
	size_t pos2 = 0;

	++counter;

	if (screen != kGame) {
		return;
	}

	updateTimers();

	if (player.mHealth == 0) {
		screen = kGameOver;
		prepareScreenFor(screen);
		return;
	}

	if (player.mStance == kAttacking) {
		evaluatePlayerAttack();

		player.mStance = kStanding;
	}

	*isOnStairs = (
			foregroundTiles[(player.mPosition.mY + 16) / 32][(player.mPosition.mX + 16) / 32] == 3);

	if (isBlockedByWall(&player)) {
		player.mSpeed.mX = 0;
	}

	if (isOnHarmfulBlock(&player) && ticksUntilVulnerable <= 0) {
		hurtPlayer(1);
	}

	if (isOnDoor(&player)) {
		advanceFloor();
	}

	player.mPosition.mX += player.mSpeed.mX;
	player.mPosition.mY += player.mSpeed.mY;

	if (player.mSpeed.mX == 1) {
		player.mSpeed.mX = 0;
	}

	if (player.mSpeed.mY == 1) {
		player.mSpeed.mY = 0;
	}

	enforceScreenLimits();

	if (player.mSpeed.mX == 0 && player.mSpeed.mY == 0 && player.mStance != kAltAttacking) {
		heroFrame = 0;
	}

	ceiling = (player.mPosition.mY) / 32;

	*isOnGround = isOnFloor(&player);

	if (*isOnStairs) {
		player.mStance = kClimbing;
		player.mSpeed.mX = 0;
	} else {
		player.mStance = kJumping;
	}

	if (*isOnGround || !*isOnStairs) {
		player.mStance = kStanding;

		if (player.mSpeed.mX == 0) {
			heroFrame = 0;
		}

	}

	if (ceiling < 0) {
		ceiling = 0;
	}

	if (player.mSpeed.mY != 0 && player.mStance == kClimbing) {
		heroFrame = (heroFrame + 1) % 2;
	}

	if ((player.mSpeed.mX != 0 && *isOnGround) || player.mStance == kAltAttacking) {
		heroFrame = (heroFrame + 1) % 2;
	}

	if (*isOnGround) {
		player.mSpeed.mX = player.mSpeed.mX / 2;
		player.mPosition.mY = (player.mPosition.mY / 32) * 32;
	}

	if (*isOnGround && !*isOnStairs) {
		player.mSpeed.mY = min(0, player.mSpeed.mY);
		player.mPosition.mY = min(player.mPosition.mY, (player.mPosition.mY / 32) * 32);
	}

	if (player.mSpeed.mY < 0 && foregroundTiles[ceiling][(player.mPosition.mX + 16) / 32] == 1) {
		player.mSpeed.mY = -player.mSpeed.mY;
	}

	if (player.mSpeed.mY < 0 &&
		foregroundTiles[player.mPosition.mY / 32][(player.mPosition.mX + 16) / 32] == 1) {
		player.mSpeed.mY = -player.mSpeed.mY;
	}

	if (!*isOnStairs) {
		player.mSpeed.mY = player.mSpeed.mY + 2;
/*this prevents from jumping while keeping the climbing animation state.
Unfortunately, prevents looking up.*/

	} else {
		player.mSpeed.mY = 0;
	}

	for (pos = 0; pos < arrows.used; ++pos) {
		struct Actor *arrow =  (struct Actor*)arrows.items[pos];

		if (arrow == NULL) {
			continue;
		}

		if (!arrow->mActive) {
			continue;
		}

		arrow->mPosition.mX += arrow->mSpeed.mX;
		arrow->mPosition.mY += arrow->mSpeed.mY;

		if (arrow->mPosition.mX >= 320 ||
			arrow->mPosition.mX < 0 ||
			arrow->mPosition.mY < 0 ||
			arrow->mPosition.mY >= 200 ||
			isBlockedByWall(arrow)) {

			removeFromVector(&arrows, arrow);
			free(arrow);
			continue;
		}

		for (pos2 = 0; pos2 < foes.used; ++pos2) {
			struct Actor *foe =  (struct Actor*)foes.items[pos2];

			if (foe == NULL || !foe->mActive) {
				continue;
			}

			if (foe->mType != kHand && collideActorActor(foe, arrow, DEFAULT_TOLERANCE)) {
				foe->mHealth--;
				removeFromVector(&arrows, arrow);
				free(arrow);


				if (foe->mType == kGargoyle) {
					openAllDoors();
				}
			}
		}
	}

	for (pos = 0; pos < items.used; ++pos) {

		struct Item *item =  (struct Item*)items.items[pos];

		if (item == NULL || !item->mActive) {
			continue;
		}

		if (collideActorItem(&player, item, DEFAULT_TOLERANCE)) {
			if (item->mType == kKey && !hasKey) {
				hasKey = TRUE;
				item->mActive = FALSE;
				playTune(pickSound);
				openAllDoors();

			} else if (item->mType == kMeat) {
				if (player.mHealth < 10) {
					playTune(pickSound);
					item->mActive = FALSE;
					player.mHealth = 10;
					playTune(pickSound);
				}
				ticksToShowHealth = 14;
			}
		}
	}

	for (pos = 0; pos < foes.used; ++pos) {
		struct Actor *foe =  (struct Actor*)foes.items[pos];

		if (foe == NULL || !foe->mActive) {
			continue;
		}

		if (foe->mType == kSpawner) {
			if ((counter % 40) == 0 && (foes.used <= 5)) {
				struct Actor *a = (struct Actor *) calloc(1, sizeof(struct Actor));
				pushVector(&foes, a);
				a->mType = kSkeleton;
				a->mSpeed.mX = 8;
				a->mPosition = foe->mPosition;
				a->mDirection = kDirectionRight;
				a->mActive = TRUE;
				a->mHealth = 2;
			}
			continue;
		}


		if ((counter % 5) == 0 && foe->mType == kHand) {
			int dx = player.mPosition.mX - foe->mPosition.mX;
			int dy = player.mPosition.mY - foe->mPosition.mY;

			if (dx > 0) {
				foe->mSpeed.mX = 1;
			} else {
				foe->mSpeed.mX = -1;
			}

			if (dy > 0) {
				foe->mSpeed.mY = 1;
			} else {
				foe->mSpeed.mY = -1;
			}

			switch (foe->mDirection) {
				case kDirectionLeft:
					if (foe->mPosition.mX < 160) {
						foe->mSpeed.mX = -foe->mSpeed.mX;
					}
					break;
				case kDirectionRight:
					if (160 <= foe->mPosition.mX) {
						foe->mSpeed.mX = -foe->mSpeed.mX;
					}
					break;
			}
		}

		if (foe->mType != kSkeleton &&
			foe->mType != kTinhoso &&
			foe->mType != kCapiroto &&
			foe->mType != kHand) {

			continue;
		}

		if (foe->mHealth <= 0) {
			foe->mActive = FALSE;

			if (foe->mType == kCapiroto) {
				screen = kVictory;
				prepareScreenFor(screen);
				return;
			} else if (foe->mType == kTinhoso) {
				hasBossOnScreen = FALSE;

				clearVector(&doors);
			}

			continue;
		}

		if (foe->mType != kSkeleton && foe->mType != kHand) {
			continue;
		}

		foe->mPosition.mX += foe->mSpeed.mX;
		foe->mPosition.mY += foe->mSpeed.mY;

		if (foe->mPosition.mX >= (320 - 32)) {
			foe->mSpeed.mX = -8;
			foe->mDirection = kDirectionLeft;
		}

		if (foe->mPosition.mX < 0) {
			foe->mSpeed.mX = 8;
			foe->mDirection = kDirectionRight;
		}

		if (isBlockedByWall(foe)) {
			foe->mSpeed.mX *= -1;

			if (foe->mDirection == kDirectionLeft) {
				foe->mDirection = kDirectionRight;
			} else {
				foe->mDirection = kDirectionLeft;
			}
		}

		if ((ticksUntilVulnerable <= 0) && collideActorActor(foe, &player, 16)) {
			hurtPlayer(1);
		}

		foe->mSpeed.mY += 2;

		if (isOnFloor(foe)) {
			foe->mSpeed.mY = 0;
			foe->mPosition.mY = (foe->mPosition.mY / 32) * 32;
		}
	}

	for (pos = 0; pos < foes.used; ++pos) {
		struct Actor *foe =  (struct Actor*)foes.items[pos];

		if (foe != NULL && foe->mType != kGargoyle && foe->mHealth <= 0) {
			removeFromVector(&foes, foe);
		}
	}
}